

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_TruthPermute_int(int *pMints,int nMints,char *pPerm,int nVars,int *pMintsP)

{
  ulong uVar1;
  ulong uVar2;
  
  memset(pMintsP,0,(long)nMints * 4);
  if (0 < nMints) {
    uVar1 = 0;
    do {
      if (0 < nVars) {
        uVar2 = 0;
        do {
          if (((uint)pMints[uVar1] >> ((uint)uVar2 & 0x1f) & 1) != 0) {
            pMintsP[uVar1] = pMintsP[uVar1] | 1 << (pPerm[uVar2] & 0x1fU);
          }
          uVar2 = uVar2 + 1;
        } while ((uint)nVars != uVar2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)nMints);
  }
  return;
}

Assistant:

void Extra_TruthPermute_int( int * pMints, int nMints, char * pPerm, int nVars, int * pMintsP )
{
    int m, v;
    // clean the storage for minterms
    memset( pMintsP, 0, sizeof(int) * nMints );
    // go through minterms and add the variables
    for ( m = 0; m < nMints; m++ )
        for ( v = 0; v < nVars; v++ )
            if ( pMints[m] & (1 << v) )
                pMintsP[m] |= (1 << pPerm[v]);
}